

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O3

shared_ptr<gui::DialogBox> __thiscall EditorInterface::createSaveDialog(EditorInterface *this)

{
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar2;
  Theme *pTVar3;
  _func_int **pp_Var4;
  DialogBox *pDVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  size_type sVar8;
  _Link_type __z;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  shared_ptr<gui::Button> *in_RSI;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *this_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar10;
  shared_ptr<gui::DialogBox> sVar11;
  shared_ptr<gui::Button> saveCancelButton;
  shared_ptr<gui::Label> saveLabel;
  shared_ptr<gui::Button> saveRefuseButton;
  shared_ptr<gui::Button> saveSubmitButton;
  shared_ptr<gui::Label> saveTitle;
  String local_160;
  undefined1 local_140 [16];
  undefined1 local_130 [24];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [24];
  shared_ptr<gui::Button> local_e0;
  shared_ptr<gui::Button> local_d0;
  shared_ptr<gui::Button> local_c0;
  _Head_base<0UL,_gui::Theme_*,_false> local_b0;
  Editor *local_a8;
  shared_ptr<gui::Label> local_a0;
  undefined1 local_90 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [24];
  _Base_ptr local_58;
  undefined1 local_50 [24];
  _Base_ptr local_38;
  
  pTVar3 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_f8);
  sf::String::String(&local_160,"saveDialog",(locale *)local_f8);
  ::gui::DialogBox::create((DialogBox *)(local_50 + 0x10),pTVar3,&local_160);
  debugWidgetCreation<gui::DialogBox>(this,(shared_ptr<gui::DialogBox> *)in_RSI);
  if (local_38 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  paVar2 = &local_160.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_f8);
  local_160.m_string._M_dataplus._M_p = (pointer)0x42c8000043960000;
  local_f8._16_8_ = this;
  ::gui::DialogBox::setSize
            ((DialogBox *)(this->super_Drawable)._vptr_Drawable,(Vector2f *)&local_160);
  pp_Var4 = (this->super_Drawable)._vptr_Drawable;
  (**(code **)(*pp_Var4 + 0x18))(pp_Var4,0);
  pp_Var4 = (this->super_Drawable)._vptr_Drawable;
  pTVar3 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_130);
  sf::String::String(&local_160,"saveTitle",(locale *)local_130);
  ::gui::Label::create((Label *)local_50,pTVar3,&local_160);
  debugWidgetCreation<gui::Label>((EditorInterface *)local_f8,(shared_ptr<gui::Label> *)in_RSI);
  if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_130);
  uVar7 = local_f8._0_8_;
  std::locale::locale((locale *)local_130);
  sf::String::String(&local_160,"Save Changes?",(locale *)local_130);
  ::gui::Label::setLabel((Label *)uVar7,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_130);
  pDVar5 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  local_a0.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f8._0_8_;
  local_a0.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
  if ((Gui *)local_f8._8_8_ != (Gui *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((EditorInterface *)(local_f8._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_f8._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((EditorInterface *)(local_f8._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_f8._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
    }
  }
  ::gui::DialogBox::setTitle(pDVar5,&local_a0);
  if ((Editor *)
      local_a0.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  pTVar3 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_108);
  sf::String::String(&local_160,"saveLabel",(locale *)local_108);
  ::gui::Label::create((Label *)(local_70 + 0x10),pTVar3,&local_160);
  debugWidgetCreation<gui::Label>((EditorInterface *)local_130,(shared_ptr<gui::Label> *)in_RSI);
  if (local_58 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_108);
  uVar7 = local_130._0_8_;
  std::locale::locale((locale *)local_108);
  sf::String::String(&local_160,"Board has been modified.",(locale *)local_108);
  ::gui::Label::setLabel((Label *)uVar7,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_108);
  ::gui::Widget::setPosition((Widget *)local_130._0_8_,10.0,30.0);
  pp_Var6 = (this->super_Drawable)._vptr_Drawable;
  local_b0._M_head_impl = (Theme *)local_130._0_8_;
  local_a8 = (Editor *)local_130._8_8_;
  if ((Editor *)local_130._8_8_ != (Editor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((weak_ptr<gui::Widget> *)
                &((EditorInterface *)(local_130._8_8_ + 8))->super_Drawable)->
               super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((weak_ptr<gui::Widget> *)
                     &((EditorInterface *)(local_130._8_8_ + 8))->super_Drawable)->
                    super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((weak_ptr<gui::Widget> *)
                &((EditorInterface *)(local_130._8_8_ + 8))->super_Drawable)->
               super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((weak_ptr<gui::Widget> *)
                     &((EditorInterface *)(local_130._8_8_ + 8))->super_Drawable)->
                    super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
    }
  }
  (**(code **)(*pp_Var6 + 0x10))(pp_Var6,&local_b0);
  if (local_a8 != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8);
  }
  pTVar3 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_118);
  sf::String::String(&local_160,"saveSubmitButton",(locale *)local_118);
  ::gui::Button::create((Button *)local_70,pTVar3,&local_160);
  debugWidgetCreation<gui::Button>((EditorInterface *)local_108,in_RSI);
  if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_118);
  uVar7 = local_108._0_8_;
  std::locale::locale((locale *)local_118);
  sf::String::String(&local_160,"Save",(locale *)local_118);
  ::gui::Button::setLabel((Button *)uVar7,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_118);
  pDVar5 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108._0_8_;
  local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
  if ((Editor *)local_108._8_8_ != (Editor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((ContainerBase *)local_108._8_8_)->children_;
      *(int *)&(pvVar1->
               super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((ContainerBase *)local_108._8_8_)->children_;
      *(int *)&(pvVar1->
               super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  ::gui::DialogBox::setSubmitButton(pDVar5,0,&local_c0);
  if ((Gui *)local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (Gui *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pTVar3 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_140);
  sf::String::String(&local_160,"saveRefuseButton",(locale *)local_140);
  ::gui::Button::create((Button *)(local_90 + 0x10),pTVar3,&local_160);
  debugWidgetCreation<gui::Button>((EditorInterface *)local_118,in_RSI);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_140);
  uVar7 = local_118._0_8_;
  std::locale::locale((locale *)local_140);
  sf::String::String(&local_160,"Don\'t Save",(locale *)local_140);
  ::gui::Button::setLabel((Button *)uVar7,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_140);
  pDVar5 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  local_d0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_118._0_8_;
  local_d0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
  if ((Editor *)local_118._8_8_ != (Editor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((EditorInterface *)(local_118._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_118._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((EditorInterface *)(local_118._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_118._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
    }
  }
  ::gui::DialogBox::setOptionButton(pDVar5,1,&local_d0);
  if ((_Base_ptr)
      local_d0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pTVar3 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)(local_130 + 0x10));
  sf::String::String(&local_160,"saveCancelButton",(locale *)(local_130 + 0x10));
  ::gui::Button::create((Button *)local_90,pTVar3,&local_160);
  debugWidgetCreation<gui::Button>((EditorInterface *)local_140,in_RSI);
  if ((element_type *)local_90._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)(local_130 + 0x10));
  uVar7 = local_140._0_8_;
  std::locale::locale((locale *)(local_130 + 0x10));
  sf::String::String(&local_160,"Cancel",(locale *)(local_130 + 0x10));
  ::gui::Button::setLabel((Button *)uVar7,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_160.m_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_160.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)(local_130 + 0x10));
  this_00 = (map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             *)(local_140._0_8_ + 600);
  sVar8 = std::
          map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::count(this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  while (sVar8 != 0) {
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    sVar8 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  }
  __z = (_Link_type)operator_new(0x50);
  *(int *)(__z->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  *(shared_ptr<gui::Button> **)((__z->_M_storage)._M_storage + 8) = in_RSI;
  *(_func_int ***)((__z->_M_storage)._M_storage + 0x10) = pp_Var4;
  *(code **)((__z->_M_storage)._M_storage + 0x20) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:573:39)>
       ::_M_invoke;
  *(code **)((__z->_M_storage)._M_storage + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:573:39)>
       ::_M_manager;
  (__z->_M_storage)._M_storage[0x28] = '\x01';
  (__z->_M_storage)._M_storage[0x29] = '\0';
  (__z->_M_storage)._M_storage[0x2a] = '\0';
  (__z->_M_storage)._M_storage[0x2b] = '\0';
  pVar10 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
           ::_M_get_insert_unique_pos
                     ((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                       *)this_00,(key_type_conflict1 *)&__z->_M_storage);
  uVar7 = local_f8._16_8_;
  if (pVar10.second == (_Base_ptr)0x0) {
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::~Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((__z->_M_storage)._M_storage + 8));
    operator_delete(__z);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                      *)this_00,pVar10.first,pVar10.second,__z);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  pDVar5 = (DialogBox *)(((Group *)uVar7)->super_Container).super_ContainerBase._vptr_ContainerBase;
  local_e0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_140._0_8_;
  local_e0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_;
  if ((Editor *)local_140._8_8_ != (Editor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((EditorInterface *)(local_140._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_140._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((EditorInterface *)(local_140._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_140._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
    }
  }
  ::gui::DialogBox::setCancelButton(pDVar5,2,&local_e0);
  _Var9._M_pi = extraout_RDX;
  if ((_Base_ptr)
      local_e0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_00;
  }
  if ((Editor *)local_140._8_8_ != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
    _Var9._M_pi = extraout_RDX_01;
  }
  if ((Editor *)local_118._8_8_ != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    _Var9._M_pi = extraout_RDX_02;
  }
  if ((_Head_base<0UL,_gui::Gui_*,_false>)local_108._8_8_ != (_Head_base<0UL,_gui::Gui_*,_false>)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
    _Var9._M_pi = extraout_RDX_03;
  }
  if ((Editor *)local_130._8_8_ != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    _Var9._M_pi = extraout_RDX_04;
  }
  if ((Editor *)local_f8._8_8_ != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    _Var9._M_pi = extraout_RDX_05;
  }
  sVar11.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  sVar11.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar7;
  return (shared_ptr<gui::DialogBox>)
         sVar11.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gui::DialogBox> EditorInterface::createSaveDialog() const {
    auto saveDialog = debugWidgetCreation(gui::DialogBox::create(*theme_, "saveDialog"));
    saveDialog->setSize({300.0f, 100.0f});
    saveDialog->setVisible(false);
    auto saveDialogPtr = saveDialog.get();

    auto saveTitle = debugWidgetCreation(gui::Label::create(*theme_, "saveTitle"));
    saveTitle->setLabel("Save Changes?");
    saveDialog->setTitle(saveTitle);

    auto saveLabel = debugWidgetCreation(gui::Label::create(*theme_, "saveLabel"));
    saveLabel->setLabel("Board has been modified.");
    saveLabel->setPosition(10.0f, 30.0f);
    saveDialog->addChild(saveLabel);

    auto saveSubmitButton = debugWidgetCreation(gui::Button::create(*theme_, "saveSubmitButton"));
    saveSubmitButton->setLabel("Save");
    saveDialog->setSubmitButton(0, saveSubmitButton);

    auto saveRefuseButton = debugWidgetCreation(gui::Button::create(*theme_, "saveRefuseButton"));
    saveRefuseButton->setLabel("Don\'t Save");
    saveDialog->setOptionButton(1, saveRefuseButton);

    auto saveCancelButton = debugWidgetCreation(gui::Button::create(*theme_, "saveCancelButton"));
    saveCancelButton->setLabel("Cancel");
    saveCancelButton->onClick.connect([this,saveDialogPtr]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
    });
    saveDialog->setCancelButton(2, saveCancelButton);

    return saveDialog;
}